

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

void trompeloeil::missed_value<trompeloeil::wildcard>(ostream *os,int i,wildcard *t)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> prefix;
  size_type *local_60;
  size_type local_50;
  undefined8 uStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_40,"_");
  local_60 = (size_type *)(pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60 == paVar4) {
    local_50 = paVar4->_M_allocated_capacity;
    uStack_48 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_60 = &local_50;
  }
  else {
    local_50 = paVar4->_M_allocated_capacity;
  }
  sVar1 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"  param ",8);
  *(ulong *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = (ulong)(i < 9) + 1;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_60,sVar1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,i + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"",0);
  std::__ostream_insert<char,std::char_traits<char>>(os," matching _",0xb);
  local_40._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_40,1);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  return;
}

Assistant:

void missed_value(
    std::ostream& os,
    int i,
    T const& t)
  {
    auto prefix = ::trompeloeil::param_name_prefix(&t) + "_";
    os << "  param " << std::setw((i < 9) ? 2 : 1) << prefix << i + 1
       << ::trompeloeil::param_compare_operator(&t);
    ::trompeloeil::print(os, t);
    os << '\n';
  }